

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypeFileInput.cpp
# Opt level: O0

EStatusCode __thiscall
OpenTypeFileInput::ReadOpenTypeFile
          (OpenTypeFileInput *this,string *inFontFilePath,unsigned_short inFaceIndex)

{
  Trace *this_00;
  undefined8 uVar1;
  IByteReaderWithPosition *inTrueTypeFile;
  undefined1 local_58 [4];
  EStatusCode status;
  InputFile fontFile;
  unsigned_short inFaceIndex_local;
  string *inFontFilePath_local;
  OpenTypeFileInput *this_local;
  
  fontFile.mFileStream._6_2_ = inFaceIndex;
  InputFile::InputFile((InputFile *)local_58);
  this_local._4_4_ = InputFile::OpenFile((InputFile *)local_58,inFontFilePath);
  if (this_local._4_4_ == eSuccess) {
    inTrueTypeFile = InputFile::GetInputStream((InputFile *)local_58);
    this_local._4_4_ = ReadOpenTypeFile(this,inTrueTypeFile,fontFile.mFileStream._6_2_);
    InputFile::CloseFile((InputFile *)local_58);
  }
  else {
    this_00 = Trace::DefaultTrace();
    uVar1 = std::__cxx11::string::c_str();
    Trace::TraceToLog(this_00,
                      "OpenTypeFileInput::ReadOpenTypeFile, cannot open true type font file at %s",
                      uVar1);
  }
  InputFile::~InputFile((InputFile *)local_58);
  return this_local._4_4_;
}

Assistant:

EStatusCode OpenTypeFileInput::ReadOpenTypeFile(const std::string& inFontFilePath, unsigned short inFaceIndex)
{
	InputFile fontFile;

	EStatusCode status = fontFile.OpenFile(inFontFilePath);
	if(status != PDFHummus::eSuccess)
	{
		TRACE_LOG1("OpenTypeFileInput::ReadOpenTypeFile, cannot open true type font file at %s",inFontFilePath.c_str());
		return status;
	}

	status = ReadOpenTypeFile(fontFile.GetInputStream(), inFaceIndex);
	fontFile.CloseFile();
	return status;
}